

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::IsTypedArrayConstructor(Var constructor,ScriptContext *scriptContext)

{
  JavascriptLibrary *this;
  JavascriptFunction *pJVar1;
  undefined1 local_21;
  JavascriptLibrary *library;
  ScriptContext *scriptContext_local;
  Var constructor_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  pJVar1 = JavascriptLibraryBase::GetInt8ArrayConstructor(&this->super_JavascriptLibraryBase);
  local_21 = true;
  if ((JavascriptFunction *)constructor != pJVar1) {
    pJVar1 = JavascriptLibraryBase::GetUint8ArrayConstructor(&this->super_JavascriptLibraryBase);
    local_21 = true;
    if ((JavascriptFunction *)constructor != pJVar1) {
      pJVar1 = JavascriptLibraryBase::GetUint8ClampedArrayConstructor
                         (&this->super_JavascriptLibraryBase);
      local_21 = true;
      if ((JavascriptFunction *)constructor != pJVar1) {
        pJVar1 = JavascriptLibraryBase::GetInt16ArrayConstructor(&this->super_JavascriptLibraryBase)
        ;
        local_21 = true;
        if ((JavascriptFunction *)constructor != pJVar1) {
          pJVar1 = JavascriptLibraryBase::GetUint16ArrayConstructor
                             (&this->super_JavascriptLibraryBase);
          local_21 = true;
          if ((JavascriptFunction *)constructor != pJVar1) {
            pJVar1 = JavascriptLibraryBase::GetInt32ArrayConstructor
                               (&this->super_JavascriptLibraryBase);
            local_21 = true;
            if ((JavascriptFunction *)constructor != pJVar1) {
              pJVar1 = JavascriptLibraryBase::GetUint32ArrayConstructor
                                 (&this->super_JavascriptLibraryBase);
              local_21 = true;
              if ((JavascriptFunction *)constructor != pJVar1) {
                pJVar1 = JavascriptLibraryBase::GetFloat32ArrayConstructor
                                   (&this->super_JavascriptLibraryBase);
                local_21 = true;
                if ((JavascriptFunction *)constructor != pJVar1) {
                  pJVar1 = JavascriptLibraryBase::GetFloat64ArrayConstructor
                                     (&this->super_JavascriptLibraryBase);
                  local_21 = (JavascriptFunction *)constructor == pJVar1;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_21;
}

Assistant:

bool JavascriptLibrary::IsTypedArrayConstructor(Var constructor, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        return constructor == library->GetInt8ArrayConstructor()
            || constructor == library->GetUint8ArrayConstructor()
            || constructor == library->GetUint8ClampedArrayConstructor()
            || constructor == library->GetInt16ArrayConstructor()
            || constructor == library->GetUint16ArrayConstructor()
            || constructor == library->GetInt32ArrayConstructor()
            || constructor == library->GetUint32ArrayConstructor()
            || constructor == library->GetFloat32ArrayConstructor()
            || constructor == library->GetFloat64ArrayConstructor();
    }